

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

string * __thiscall
soul::AST::CallOrCastBase::getDescription
          (string *__return_storage_ptr__,CallOrCastBase *this,string *name)

{
  long lVar1;
  undefined8 *puVar2;
  long *plVar3;
  size_type *psVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined1 in_R8B;
  ArrayView<soul::Type> types;
  ArrayView<soul::Type> types_00;
  TypeArray argTypes;
  undefined1 local_150 [32];
  string local_130;
  undefined1 local_110 [32];
  TypeArray local_f0;
  
  local_150._0_8_ = (this->arguments).object;
  CommaSeparatedList::getListOfResultTypes(&local_f0,(pool_ptr<soul::AST::Expression> *)local_150);
  if (this->isMethodCall == true) {
    if (local_f0.numActive == 0) {
      throwInternalCompilerError("! argTypes.empty()","getDescription",0x893);
    }
    Type::getDescription_abi_cxx11_((string *)local_110,local_f0.items);
    TokenisedPathString::join((string *)local_150,(string *)local_110,name);
    if (local_f0.numActive == 0) {
      throwInternalCompilerError("! empty()","tail",0xca);
    }
    types.e = (Type *)0x1;
    types.s = local_f0.items + local_f0.numActive;
    heart::Utilities::getDescriptionOfTypeList_abi_cxx11_
              (&local_130,(Utilities *)(local_f0.items + 1),types,(bool)in_R8B);
    uVar5 = 0xf;
    if ((CommaSeparatedList *)local_150._0_8_ != (CommaSeparatedList *)(local_150 + 0x10)) {
      uVar5 = local_150._16_8_;
    }
    if (uVar5 < local_130._M_string_length + local_150._8_8_) {
      uVar6 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        uVar6 = local_130.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < local_130._M_string_length + local_150._8_8_) goto LAB_001f81a5;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,local_150._0_8_);
    }
    else {
LAB_001f81a5:
      puVar2 = (undefined8 *)
               std::__cxx11::string::_M_append(local_150,(ulong)local_130._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = puVar2 + 2;
    if ((size_type *)*puVar2 == psVar4) {
      uVar6 = puVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = puVar2[1];
    *puVar2 = psVar4;
    puVar2[1] = 0;
    *(undefined1 *)psVar4 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((CommaSeparatedList *)local_150._0_8_ != (CommaSeparatedList *)(local_150 + 0x10)) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    local_150._16_8_ = local_110._16_8_;
    if ((CommaSeparatedList *)local_110._0_8_ == (CommaSeparatedList *)(local_110 + 0x10))
    goto LAB_001f82e1;
  }
  else {
    types_00.e = (Type *)0x1;
    types_00.s = local_f0.items + local_f0.numActive;
    heart::Utilities::getDescriptionOfTypeList_abi_cxx11_
              ((string *)local_150,(Utilities *)local_f0.items,types_00,(bool)in_R8B);
    plVar3 = (long *)std::__cxx11::string::replace
                               ((ulong)local_150,0,(char *)0x0,(ulong)(name->_M_dataplus)._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar4) {
      lVar1 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_110._0_8_ = local_150._0_8_;
    if ((CommaSeparatedList *)local_150._0_8_ == (CommaSeparatedList *)(local_150 + 0x10))
    goto LAB_001f82e1;
  }
  operator_delete((void *)local_110._0_8_,local_150._16_8_ + 1);
LAB_001f82e1:
  ArrayWithPreallocation<soul::Type,_8UL>::clear(&local_f0);
  return __return_storage_ptr__;
}

Assistant:

std::string getDescription (std::string name) const
        {
            auto argTypes = getArgumentTypes();

            if (isMethodCall)
            {
                SOUL_ASSERT (! argTypes.empty());

                return TokenisedPathString::join (argTypes.front().getDescription(), name)
                        + heart::Utilities::getDescriptionOfTypeList (ArrayView<Type> (argTypes).tail(), true);
            }

            return name + heart::Utilities::getDescriptionOfTypeList (argTypes, true);
        }